

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O2

int __thiscall QtMWidgets::ToolBarLayout::spaceNeeded(ToolBarLayout *this)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  QForeachContainer<QList<QLayoutItem_*>_> _container_212;
  QForeachContainer<QList<QLayoutItem_*>_> QStack_58;
  
  QtPrivate::QForeachContainer<QList<QLayoutItem_*>_>::QForeachContainer(&QStack_58,&this->buttons);
  iVar5 = 0;
  iVar4 = 0;
  for (; QStack_58.i.i != QStack_58.e.i; QStack_58.i.i = QStack_58.i.i + 1) {
    uVar3 = (**(code **)(*(long *)*QStack_58.i.i + 0x10))();
    iVar1 = (**(code **)(*(long *)this + 0x60))(this);
    iVar2 = (**(code **)(*(long *)this + 0x60))(this);
    iVar5 = iVar5 + (int)uVar3 + iVar1;
    iVar4 = iVar4 + (int)((ulong)uVar3 >> 0x20) + iVar2;
  }
  QArrayDataPointer<QLayoutItem_*>::~QArrayDataPointer
            ((QArrayDataPointer<QLayoutItem_*> *)&QStack_58);
  if (this->orient == Horizontal) {
    iVar4 = iVar5;
  }
  return iVar4;
}

Assistant:

int
ToolBarLayout::spaceNeeded() const
{
	QSize size( 0, 0 );

	foreach( QLayoutItem * item, buttons )
	{
		size += item->sizeHint();
		size += QSize( spacing(), spacing() );
	}

	if( orient == Qt::Horizontal )
		return size.width();
	else
		return size.height();
}